

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

ExecutionReport *
anon_unknown.dwarf_2926b4::createExecutionReport
          (ExecutionReport *__return_storage_ptr__,char *sender,char *target,int seq)

{
  int iVar1;
  Header *pHVar2;
  Trailer *this;
  FieldBase local_8e8;
  FieldBase local_890;
  ContraTradeTime local_838;
  QTY local_7e0;
  ContraTradeQty local_7d8;
  allocator<char> local_779;
  STRING local_778;
  ContraTrader local_758;
  allocator<char> local_6f9;
  STRING local_6f8;
  ContraBroker local_6d8;
  ContraTradeTime local_680;
  QTY local_628;
  ContraTradeQty local_620;
  allocator<char> local_5c1;
  STRING local_5c0;
  ContraTrader local_5a0;
  allocator<char> local_541;
  STRING local_540;
  ContraBroker local_520;
  undefined1 local_4c8 [8];
  NoContraBrokers noContraBrokers;
  AvgPx local_448;
  QTY local_3f0;
  CumQty local_3e8;
  QTY local_390;
  LeavesQty local_388;
  Side local_330;
  allocator<char> local_2d1;
  STRING local_2d0;
  Symbol local_2b0;
  CHAR local_251;
  OrdStatus local_250;
  CHAR local_1f1;
  ExecType local_1f0;
  CHAR local_191;
  ExecTransType local_190;
  allocator<char> local_131;
  STRING local_130;
  ExecID local_110;
  allocator<char> local_a1;
  STRING local_a0;
  OrderID local_80;
  byte local_25;
  int local_24;
  char *pcStack_20;
  int seq_local;
  char *target_local;
  char *sender_local;
  ExecutionReport *executionReport;
  
  local_25 = 0;
  local_24 = seq;
  pcStack_20 = target;
  target_local = sender;
  sender_local = (char *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"ID",&local_a1);
  FIX::OrderID::OrderID(&local_80,&local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"ID",&local_131);
  FIX::ExecID::ExecID(&local_110,&local_130);
  local_191 = '0';
  FIX::ExecTransType::ExecTransType(&local_190,&local_191);
  local_1f1 = '0';
  FIX::ExecType::ExecType(&local_1f0,&local_1f1);
  local_251 = '0';
  FIX::OrdStatus::OrdStatus(&local_250,&local_251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"SYMBOL",&local_2d1);
  FIX::Symbol::Symbol(&local_2b0,&local_2d0);
  FIX::Side::Side(&local_330,"11ZN12_GLOBAL__N_123CATCH2_INTERNAL_TEST_434testEvE3$_2");
  local_390 = 100.0;
  FIX::LeavesQty::LeavesQty(&local_388,&local_390);
  local_3f0 = 0.0;
  FIX::CumQty::CumQty(&local_3e8,&local_3f0);
  noContraBrokers.super_Group.m_field = 0;
  noContraBrokers.super_Group.m_delim = 0;
  FIX::AvgPx::AvgPx(&local_448,(PRICE *)&noContraBrokers.super_Group.m_field);
  FIX42::ExecutionReport::ExecutionReport
            (__return_storage_ptr__,&local_80,&local_110,&local_190,&local_1f0,&local_250,&local_2b0
             ,&local_330,&local_388,&local_3e8,&local_448);
  FIX::AvgPx::~AvgPx(&local_448);
  FIX::CumQty::~CumQty(&local_3e8);
  FIX::LeavesQty::~LeavesQty(&local_388);
  FIX::Side::~Side(&local_330);
  FIX::Symbol::~Symbol(&local_2b0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  FIX::OrdStatus::~OrdStatus(&local_250);
  FIX::ExecType::~ExecType(&local_1f0);
  FIX::ExecTransType::~ExecTransType(&local_190);
  FIX::ExecID::~ExecID(&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  FIX::OrderID::~OrderID(&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  pHVar2 = FIX42::Message::getHeader(&__return_storage_ptr__->super_Message);
  fillHeader((Header *)pHVar2,target_local,pcStack_20,local_24);
  FIX42::ExecutionReport::NoContraBrokers::NoContraBrokers((NoContraBrokers *)local_4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_540,"BROKER",&local_541);
  FIX::ContraBroker::ContraBroker(&local_520,&local_540);
  FIX42::ExecutionReport::NoContraBrokers::set((NoContraBrokers *)local_4c8,&local_520);
  FIX::ContraBroker::~ContraBroker(&local_520);
  std::__cxx11::string::~string((string *)&local_540);
  std::allocator<char>::~allocator(&local_541);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5c0,"TRADER",&local_5c1);
  FIX::ContraTrader::ContraTrader(&local_5a0,&local_5c0);
  FIX42::ExecutionReport::NoContraBrokers::set((NoContraBrokers *)local_4c8,&local_5a0);
  FIX::ContraTrader::~ContraTrader(&local_5a0);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::allocator<char>::~allocator(&local_5c1);
  local_628 = 100.0;
  FIX::ContraTradeQty::ContraTradeQty(&local_620,&local_628);
  FIX42::ExecutionReport::NoContraBrokers::set((NoContraBrokers *)local_4c8,&local_620);
  FIX::ContraTradeQty::~ContraTradeQty(&local_620);
  FIX::ContraTradeTime::now();
  FIX42::ExecutionReport::NoContraBrokers::set((NoContraBrokers *)local_4c8,&local_680);
  FIX::ContraTradeTime::~ContraTradeTime(&local_680);
  FIX::Message::addGroup((Message *)__return_storage_ptr__,(Group *)local_4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6f8,"BROKER2",&local_6f9);
  FIX::ContraBroker::ContraBroker(&local_6d8,&local_6f8);
  FIX42::ExecutionReport::NoContraBrokers::set((NoContraBrokers *)local_4c8,&local_6d8);
  FIX::ContraBroker::~ContraBroker(&local_6d8);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::allocator<char>::~allocator(&local_6f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_778,"TRADER2",&local_779);
  FIX::ContraTrader::ContraTrader(&local_758,&local_778);
  FIX42::ExecutionReport::NoContraBrokers::set((NoContraBrokers *)local_4c8,&local_758);
  FIX::ContraTrader::~ContraTrader(&local_758);
  std::__cxx11::string::~string((string *)&local_778);
  std::allocator<char>::~allocator(&local_779);
  local_7e0 = 100.0;
  FIX::ContraTradeQty::ContraTradeQty(&local_7d8,&local_7e0);
  FIX42::ExecutionReport::NoContraBrokers::set((NoContraBrokers *)local_4c8,&local_7d8);
  FIX::ContraTradeQty::~ContraTradeQty(&local_7d8);
  FIX::ContraTradeTime::now();
  FIX42::ExecutionReport::NoContraBrokers::set((NoContraBrokers *)local_4c8,&local_838);
  FIX::ContraTradeTime::~ContraTradeTime(&local_838);
  FIX::Message::addGroup((Message *)__return_storage_ptr__,(Group *)local_4c8);
  pHVar2 = FIX42::Message::getHeader(&__return_storage_ptr__->super_Message);
  iVar1 = FIX::Message::bodyLength((Message *)__return_storage_ptr__,8,9,10);
  FIX::BodyLength::BodyLength((BodyLength *)&local_890,iVar1);
  FIX::FieldMap::setField((FieldMap *)pHVar2,&local_890,true);
  FIX::BodyLength::~BodyLength((BodyLength *)&local_890);
  this = FIX42::Message::getTrailer(&__return_storage_ptr__->super_Message);
  iVar1 = FIX::Message::checkSum((Message *)__return_storage_ptr__,10);
  FIX::CheckSum::CheckSum((CheckSum *)&local_8e8,iVar1);
  FIX::FieldMap::setField((FieldMap *)this,&local_8e8,true);
  FIX::CheckSum::~CheckSum((CheckSum *)&local_8e8);
  local_25 = 1;
  FIX42::ExecutionReport::NoContraBrokers::~NoContraBrokers((NoContraBrokers *)local_4c8);
  if ((local_25 & 1) == 0) {
    FIX42::ExecutionReport::~ExecutionReport(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

FIX42::ExecutionReport createExecutionReport(const char *sender, const char *target, int seq) {
  FIX42::ExecutionReport executionReport(
      OrderID("ID"),
      ExecID("ID"),
      ExecTransType('0'),
      ExecType('0'),
      OrdStatus('0'),
      Symbol("SYMBOL"),
      Side(Side_BUY),
      LeavesQty(100),
      CumQty(0),
      AvgPx(0));
  fillHeader(executionReport.getHeader(), sender, target, seq);
  FIX42::ExecutionReport::NoContraBrokers noContraBrokers;
  noContraBrokers.set(ContraBroker("BROKER"));
  noContraBrokers.set(ContraTrader("TRADER"));
  noContraBrokers.set(ContraTradeQty(100));
  noContraBrokers.set(ContraTradeTime::now());
  executionReport.addGroup(noContraBrokers);
  noContraBrokers.set(ContraBroker("BROKER2"));
  noContraBrokers.set(ContraTrader("TRADER2"));
  noContraBrokers.set(ContraTradeQty(100));
  noContraBrokers.set(ContraTradeTime::now());
  executionReport.addGroup(noContraBrokers);
  executionReport.getHeader().setField(BodyLength(executionReport.bodyLength()));
  executionReport.getTrailer().setField(CheckSum(executionReport.checkSum()));
  return executionReport;
}